

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void __thiscall coins_tests::ccoins_access::test_method(ccoins_access *this)

{
  long lVar1;
  char in_R9B;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,-2,-2,0xffffffff,-1,in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,-1,-1,0,'\0',in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,-1,-1,2,'\x02',in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,-1,-1,1,'\x01',in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,-1,-1,3,'\x03',in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,200,200,0,'\0',in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,200,200,2,'\x02',in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,200,200,1,'\x01',in_R9B);
  CheckAccessCoin((coins_tests *)0xfffffffffffffffe,200,200,3,'\x03',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,-2,-2,0xffffffff,-1,in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,-1,-1,0,'\0',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,-1,-1,2,'\x02',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,-1,-1,1,'\x01',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,-1,-1,3,'\x03',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,200,200,0,'\0',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,200,200,2,'\x02',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,200,200,1,'\x01',in_R9B);
  CheckAccessCoin((coins_tests *)0xffffffffffffffff,200,200,3,'\x03',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,-2,100,0xffffffff,'\0',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,-1,-1,0,'\0',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,-1,-1,2,'\x02',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,-1,-1,1,'\x01',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,-1,-1,3,'\x03',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,200,200,0,'\0',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,200,200,2,'\x02',in_R9B);
  CheckAccessCoin((coins_tests *)0x64,200,200,1,'\x01',in_R9B);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CheckAccessCoin((coins_tests *)0x64,200,200,3,'\x03',in_R9B);
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_access)
{
    /* Check AccessCoin behavior, requesting a coin from a cache view layered on
     * top of a base view, and checking the resulting entry in the cache after
     * the access.
     *
     *               Base    Cache   Result  Cache        Result
     *               Value   Value   Value   Flags        Flags
     */
    CheckAccessCoin(ABSENT, ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckAccessCoin(ABSENT, SPENT , SPENT , 0          , 0          );
    CheckAccessCoin(ABSENT, SPENT , SPENT , FRESH      , FRESH      );
    CheckAccessCoin(ABSENT, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckAccessCoin(ABSENT, SPENT , SPENT , DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, 0          , 0          );
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, FRESH      , FRESH      );
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, DIRTY      , DIRTY      );
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(SPENT , ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckAccessCoin(SPENT , SPENT , SPENT , 0          , 0          );
    CheckAccessCoin(SPENT , SPENT , SPENT , FRESH      , FRESH      );
    CheckAccessCoin(SPENT , SPENT , SPENT , DIRTY      , DIRTY      );
    CheckAccessCoin(SPENT , SPENT , SPENT , DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(SPENT , VALUE2, VALUE2, 0          , 0          );
    CheckAccessCoin(SPENT , VALUE2, VALUE2, FRESH      , FRESH      );
    CheckAccessCoin(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY      );
    CheckAccessCoin(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(VALUE1, ABSENT, VALUE1, NO_ENTRY   , 0          );
    CheckAccessCoin(VALUE1, SPENT , SPENT , 0          , 0          );
    CheckAccessCoin(VALUE1, SPENT , SPENT , FRESH      , FRESH      );
    CheckAccessCoin(VALUE1, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckAccessCoin(VALUE1, SPENT , SPENT , DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, 0          , 0          );
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, FRESH      , FRESH      );
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, DIRTY      , DIRTY      );
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH);
}